

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLexer.cpp
# Opt level: O0

shared_ptr<LToken> __thiscall LLexer::next_token(LLexer *this)

{
  char cVar1;
  int iVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  string *in_RSI;
  shared_ptr<LToken> sVar4;
  string local_268 [32];
  string local_248 [32];
  string local_228 [32];
  string local_208 [36];
  undefined4 local_1e4;
  string local_1e0 [35];
  undefined1 local_1bd;
  char local_1a9;
  stringstream local_1a8 [7];
  char c;
  stringstream ss;
  ostream local_198 [376];
  undefined4 local_20;
  char local_1c [4];
  int state;
  LLexer *this_local;
  shared_ptr<LToken> *token;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  
  this_local = this;
  cVar1 = (**(code **)(*(long *)in_RSI + 0x10))();
  if (cVar1 != '\0') {
    local_20 = 0;
    std::__cxx11::stringstream::stringstream(local_1a8);
    do {
      local_1a9 = (**(code **)(*(long *)in_RSI + 0x10))();
      switch(local_20) {
      case 0:
        iVar2 = is_blank(local_1a9);
        if (iVar2 == 0) {
          iVar2 = is_num(local_1a9);
          if (iVar2 == 0) {
            iVar2 = is_word_char(local_1a9);
            if (iVar2 == 0) {
              iVar2 = is_minus(local_1a9);
              if (iVar2 == 0) {
                iVar2 = is_single_symbol(local_1a9);
                if (iVar2 != 0) {
                  std::operator<<(local_198,local_1a9);
                  local_1bd = 0;
                  std::__cxx11::stringstream::str();
                  from_symbol(this,in_RSI);
                  std::__cxx11::string::~string(local_1e0);
                  (**(code **)(*(long *)in_RSI + 0x18))();
                  local_1bd = 1;
                  goto LAB_001341a5;
                }
                iVar2 = is_double_symbol(local_1a9);
                if (iVar2 != 0) {
                  std::operator<<(local_198,local_1a9);
                  (**(code **)(*(long *)in_RSI + 0x18))();
                  cVar1 = (**(code **)(*(long *)in_RSI + 0x10))();
                  if (cVar1 == '=') {
                    std::operator<<(local_198,local_1a9);
                    (**(code **)(*(long *)in_RSI + 0x18))();
                  }
                  std::__cxx11::stringstream::str();
                  from_symbol(this,in_RSI);
                  std::__cxx11::string::~string(local_208);
                  goto LAB_001341a5;
                }
              }
              else {
                local_20 = 3;
              }
            }
            else {
              local_20 = 2;
            }
          }
          else {
            local_20 = 1;
          }
        }
        else {
          local_20 = 0;
        }
        break;
      case 1:
        iVar2 = is_num(local_1a9);
        if (iVar2 == 0) {
          std::__cxx11::stringstream::str();
          from_int(this,in_RSI);
          std::__cxx11::string::~string(local_228);
          goto LAB_001341a5;
        }
        break;
      case 2:
        iVar2 = is_word_char(local_1a9);
        if ((iVar2 == 0) && (iVar2 = is_num(local_1a9), iVar2 == 0)) {
          std::__cxx11::stringstream::str();
          from_string(this,in_RSI);
          std::__cxx11::string::~string(local_248);
          goto LAB_001341a5;
        }
        break;
      case 3:
        iVar2 = is_num('\x03');
        if (iVar2 == 0) {
          std::__cxx11::stringstream::str();
          from_symbol(this,in_RSI);
          std::__cxx11::string::~string(local_268);
          goto LAB_001341a5;
        }
        local_20 = 1;
        break;
      default:
        goto switchD_00133c82_default;
      }
      iVar2 = is_blank(local_1a9);
      if (iVar2 == 0) {
        std::operator<<(local_198,local_1a9);
      }
      (**(code **)(*(long *)in_RSI + 0x18))();
    } while( true );
  }
  local_1c[0] = '\t';
  local_1c[1] = '\0';
  local_1c[2] = '\0';
  local_1c[3] = '\0';
  sVar4 = std::make_shared<LToken,LNodeType,char_const(&)[1]>
                    ((LNodeType *)this,(char (*) [1])local_1c);
  _Var3 = sVar4.super___shared_ptr<LToken,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
LAB_001341c1:
  sVar4.super___shared_ptr<LToken,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var3._M_pi;
  sVar4.super___shared_ptr<LToken,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<LToken>)sVar4.super___shared_ptr<LToken,_(__gnu_cxx::_Lock_policy)2>;
switchD_00133c82_default:
  std::shared_ptr<LToken>::shared_ptr((shared_ptr<LToken> *)this,(nullptr_t)0x0);
LAB_001341a5:
  local_1e4 = 1;
  std::__cxx11::stringstream::~stringstream(local_1a8);
  _Var3._M_pi = extraout_RDX;
  goto LAB_001341c1;
}

Assistant:

std::shared_ptr<LToken> LLexer::next_token() {
    if (this->peek() == 0) return std::make_shared<LToken>(LNodeType::EOFF, "");
    int state = 0;
    std::stringstream ss;
    while (true) {
        char c = this->peek();
        switch (state) {
            case 0:
                if (is_blank(c)) {
                    state = 0;
                } else if (is_num(c)) {
                    state = 1;
                } else if (is_word_char(c)) {
                    state = 2;
                } else if (is_minus(c)) {
                    state = 3;
                } else if (is_single_symbol(c)) {
                    ss << c;
                    auto token = this->from_symbol(ss.str());
                    this->move();
                    return token;
                } else if (is_double_symbol(c)) {
                    ss << c;
                    this->move();
                    if (this->peek() == '=') {
                        ss << c;
                        this->move();
                    }
                    return this->from_symbol(ss.str());
                }
                break;
            case 1:
                if (!is_num(c)) {
                    return this->from_int(ss.str());
                }
                break;
            case 2:
                if (!(is_word_char(c) || is_num(c))) {
                    return this->from_string(ss.str());
                }
                break;
            case 3:
                if (is_num(3)) {
                    state = 1;
                } else {
                    return this->from_symbol(ss.str());
                }
                break;
            default:
                return nullptr;
        }
        if (!is_blank(c)) ss << c;
        this->move();
    }
}